

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * CMU462::outer(Vector3D *u,Vector3D *v)

{
  double *in_RDX;
  double *in_RSI;
  Matrix3x3 *in_RDI;
  double *Bij;
  Matrix3x3 *B;
  Matrix3x3 *in_stack_ffffffffffffffe0;
  
  Matrix3x3::Matrix3x3(in_stack_ffffffffffffffe0);
  in_RDI->entries[0].x = *in_RSI * *in_RDX;
  in_RDI->entries[0].y = in_RSI[1] * *in_RDX;
  in_RDI->entries[0].z = in_RSI[2] * *in_RDX;
  in_RDI->entries[1].x = *in_RSI * in_RDX[1];
  in_RDI->entries[1].y = in_RSI[1] * in_RDX[1];
  in_RDI->entries[1].z = in_RSI[2] * in_RDX[1];
  in_RDI->entries[2].x = *in_RSI * in_RDX[2];
  in_RDI->entries[2].y = in_RSI[1] * in_RDX[2];
  in_RDI->entries[2].z = in_RSI[2] * in_RDX[2];
  return in_RDI;
}

Assistant:

Matrix3x3 outer( const Vector3D& u, const Vector3D& v ) {
    Matrix3x3 B;
    double* Bij = (double*) &B;

    *Bij++ = u.x*v.x;
    *Bij++ = u.y*v.x;
    *Bij++ = u.z*v.x;
    *Bij++ = u.x*v.y;
    *Bij++ = u.y*v.y;
    *Bij++ = u.z*v.y;
    *Bij++ = u.x*v.z;
    *Bij++ = u.y*v.z;
    *Bij++ = u.z*v.z;

    return B;
  }